

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O2

Nwk_Grf_t * Nwk_ManGraphAlloc(int nVertsMax)

{
  ulong uVar1;
  uint uVar2;
  Nwk_Grf_t *pNVar3;
  Nwk_Edg_t **ppNVar4;
  Aig_MmFixed_t *pAVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  uint uVar8;
  uint nEntriesMax;
  int iVar9;
  ulong uVar10;
  
  pNVar3 = (Nwk_Grf_t *)calloc(1,0xe0);
  pNVar3->nVertsMax = nVertsMax;
  uVar8 = nVertsMax * 3 - 1;
  do {
    do {
      nEntriesMax = uVar8 + 1;
      uVar2 = uVar8 & 1;
      uVar8 = nEntriesMax;
    } while (uVar2 != 0);
    uVar10 = 3;
    do {
      iVar9 = (int)uVar10;
      if (nEntriesMax < (uint)(iVar9 * iVar9)) {
        pNVar3->nEdgeHash = nEntriesMax;
        ppNVar4 = (Nwk_Edg_t **)calloc((long)(int)nEntriesMax,8);
        pNVar3->pEdgeHash = ppNVar4;
        pAVar5 = Aig_MmFixedStart(0x10,nEntriesMax);
        pNVar3->pMemEdges = pAVar5;
        pVVar6 = (Vec_Int_t *)malloc(0x10);
        pVVar6->nCap = 1000;
        pVVar6->nSize = 0;
        piVar7 = (int *)malloc(4000);
        pVVar6->pArray = piVar7;
        pNVar3->vPairs = pVVar6;
        return pNVar3;
      }
      uVar1 = (ulong)nEntriesMax % uVar10;
      uVar10 = (ulong)(iVar9 + 2);
    } while ((int)uVar1 != 0);
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the graph.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Nwk_Grf_t * Nwk_ManGraphAlloc( int nVertsMax )
{
    Nwk_Grf_t * p;
    p = ABC_ALLOC( Nwk_Grf_t, 1 );
    memset( p, 0, sizeof(Nwk_Grf_t) );
    p->nVertsMax = nVertsMax;
    p->nEdgeHash = Abc_PrimeCudd( 3 * nVertsMax );
    p->pEdgeHash = ABC_CALLOC( Nwk_Edg_t *, p->nEdgeHash );
    p->pMemEdges = Aig_MmFixedStart( sizeof(Nwk_Edg_t), p->nEdgeHash );
    p->vPairs    = Vec_IntAlloc( 1000 );
    return p;
}